

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
llvm::cl::Option::Option(Option *this,NumOccurrencesFlag OccurrencesFlag,OptionHidden Hidden)

{
  OptionHidden Hidden_local;
  NumOccurrencesFlag OccurrencesFlag_local;
  Option *this_local;
  
  this->_vptr_Option = (_func_int **)&PTR___cxa_pure_virtual_003009b0;
  this->NumOccurrences = 0;
  *(ushort *)&this->field_0xc = *(ushort *)&this->field_0xc & 0xfff8 | (ushort)OccurrencesFlag & 7;
  *(ushort *)&this->field_0xc = *(ushort *)&this->field_0xc & 0xffe7;
  *(ushort *)&this->field_0xc = *(ushort *)&this->field_0xc & 0xff9f | ((ushort)Hidden & 3) << 5;
  *(ushort *)&this->field_0xc = *(ushort *)&this->field_0xc & 0xfe7f;
  *(ushort *)&this->field_0xc = *(ushort *)&this->field_0xc & 0xf1ff;
  this->Position = 0;
  this->AdditionalVals = 0;
  StringRef::StringRef(&this->ArgStr);
  StringRef::StringRef(&this->HelpStr);
  StringRef::StringRef(&this->ValueStr);
  this->Category = (OptionCategory *)GeneralCategory;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U>::SmallPtrSet(&this->Subs);
  this->FullyInitialized = false;
  return;
}

Assistant:

explicit Option(enum NumOccurrencesFlag OccurrencesFlag,
                  enum OptionHidden Hidden)
      : Occurrences(OccurrencesFlag), Value(0), HiddenFlag(Hidden),
        Formatting(NormalFormatting), Misc(0), Category(&GeneralCategory) {}